

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Oop __thiscall Lodtalk::MethodCompiler::visitMethodAST(MethodCompiler *this,MethodAST *node)

{
  VMContext *pVVar1;
  PragmaDefinition *this_00;
  LiteralNode *this_01;
  MethodHeader *pMVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ArgumentList *this_02;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *this_03;
  PragmaList *this_04;
  Pragmas *this_05;
  AdditionalMethodState *pAVar7;
  const_reference ppPVar8;
  string *psVar9;
  Parameters *this_06;
  SmallIntegerValue SVar10;
  Pragma *pPVar11;
  size_type indexableSize;
  Array *pointer;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar12;
  Oop *pOVar13;
  void *pvVar14;
  value_type pNVar15;
  const_reference ppNVar16;
  LocalVariables *this_07;
  value_type *pvVar17;
  __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var18;
  element_type *peVar19;
  LocalVariables *this_08;
  SequenceNode *pSVar20;
  Oop newLiteral;
  CompiledMethod *pointer_00;
  Pragma *pragma_1;
  size_t i_4;
  Oop *pragmas_1;
  value_type *localVar_2;
  size_t i_3;
  value_type *localVar_1;
  size_t i_2;
  LocalVariables *localVars;
  value_type *localVar;
  size_t i_1;
  size_t capturedCount;
  LocalVariables *blockLocals;
  LiteralNode *paramLiteralNode;
  value_type paramNode;
  size_t j;
  Oop *argumentsData;
  anon_union_8_4_0eb573b0_for_Oop_0 local_f0;
  Oop number;
  LiteralNode *numberParamLiteral;
  value_type numberParam;
  Parameters *params;
  string *selector;
  value_type pragma;
  size_t i;
  Ref<Lodtalk::Pragma> pragmaObject;
  Pragmas *pragmas;
  size_t pragmaCount;
  bool hasPrimitive;
  PragmaList *pragmaList;
  ArgumentList *argumentList;
  string local_60;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  MethodHeader *local_38;
  MethodHeader *header;
  size_t argumentCount;
  size_t temporalCount;
  MethodAST *node_local;
  MethodCompiler *this_local;
  Oop result;
  
  argumentCount = 0;
  header = (MethodHeader *)0x0;
  this->localContext = &node->super_FunctionalNode;
  this->temporalVectorCount = 0;
  temporalCount = (size_t)node;
  node_local = (MethodAST *)this;
  local_38 = AST::MethodAST::getHeader(node);
  pVVar1 = this->context;
  AST::MethodHeader::getSelector_abi_cxx11_(&local_60,local_38);
  local_40 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeSelector(pVVar1,&local_60);
  OopRef::operator=(&this->selector,(Oop *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  this_02 = AST::MethodHeader::getArgumentList(local_38);
  if (this_02 != (ArgumentList *)0x0) {
    this_03 = AST::ArgumentList::getArguments(this_02);
    header = (MethodHeader *)
             std::vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>::size
                       (this_03);
  }
  this_04 = AST::MethodAST::getPragmaList((MethodAST *)temporalCount);
  pragmaCount._7_1_ = false;
  pragmas = (Pragmas *)0x0;
  if (this_04 != (PragmaList *)0x0) {
    this_05 = AST::PragmaList::getPragmas(this_04);
    bVar3 = std::
            vector<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
            ::empty(this_05);
    if (!bVar3) {
      pragmaObject.reference.nextReference_ = (OopRef *)AST::PragmaList::getPragmas(this_04);
      pragmas = (Pragmas *)
                std::
                vector<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
                ::size((vector<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
                        *)pragmaObject.reference.nextReference_);
      Ref<Lodtalk::Pragma>::Ref((Ref<Lodtalk::Pragma> *)&i,this->context);
      pAVar7 = AdditionalMethodState::basicNew(this->context,(size_t)pragmas);
      Ref<Lodtalk::AdditionalMethodState>::operator=(&this->additionalMethodState,pAVar7);
      pAVar7 = Ref<Lodtalk::AdditionalMethodState>::operator->(&this->additionalMethodState);
      AdditionalMethodState::setSelector(pAVar7,&(this->selector).oop);
      for (pragma = (value_type)0x0; pragma < pragmas;
          pragma = (value_type)((long)&(pragma->super_Node)._vptr_Node + 1)) {
        ppPVar8 = std::
                  vector<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
                  ::operator[]((vector<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
                                *)pragmaObject.reference.nextReference_,(size_type)pragma);
        this_00 = *ppPVar8;
        psVar9 = AST::PragmaDefinition::getSelectorString_abi_cxx11_(this_00);
        this_06 = AST::PragmaDefinition::getParameters(this_00);
        bVar3 = std::operator==(psVar9,"primitive:");
        if ((bVar3) || (bVar3 = std::operator==(psVar9,"primitive:error:"), bVar3)) {
          pragmaCount._7_1_ = true;
          ppNVar16 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::
                     operator[](this_06,0);
          uVar4 = (*(*ppNVar16)->_vptr_Node[3])();
          if ((uVar4 & 1) != 0) {
            ppNVar16 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::
                       operator[](this_06,0);
            number.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)*ppNVar16;
            local_f0 = (anon_union_8_4_0eb573b0_for_Oop_0)
                       AST::LiteralNode::getValue((LiteralNode *)number.field_0);
            bVar3 = Oop::isSmallInteger((Oop *)&local_f0);
            if (bVar3) {
              pragmaCount._7_1_ = true;
              SVar10 = Oop::decodeSmallInteger((Oop *)&local_f0);
              MethodAssembler::Assembler::callPrimitive(&this->gen,(int)SVar10);
              goto LAB_001a7346;
            }
          }
        }
        else {
          bVar3 = std::operator==(psVar9,"primitive:module:");
          if ((bVar3) || (bVar3 = std::operator==(psVar9,"primitive:module:error:"), bVar3)) {
            pragmaCount._7_1_ = true;
            MethodAssembler::Assembler::callPrimitive(&this->gen,0x100);
          }
LAB_001a7346:
          pPVar11 = Pragma::create(this->context);
          Ref<Lodtalk::Pragma>::operator=((Ref<Lodtalk::Pragma> *)&i,pPVar11);
          pVVar1 = this->context;
          indexableSize =
               std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::size
                         (this_06);
          pointer = Array::basicNativeNew(pVVar1,indexableSize);
          aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::fromPointer(pointer);
          pPVar11 = Ref<Lodtalk::Pragma>::operator->((Ref<Lodtalk::Pragma> *)&i);
          (pPVar11->arguments).field_0 = aVar12;
          pVVar1 = this->context;
          psVar9 = AST::PragmaDefinition::getSelectorString_abi_cxx11_(this_00);
          aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeByteSymbol(pVVar1,psVar9);
          pPVar11 = Ref<Lodtalk::Pragma>::operator->((Ref<Lodtalk::Pragma> *)&i);
          (pPVar11->keyword).field_0 = aVar12;
          aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)
                   Ref<Lodtalk::Pragma>::getOop((Ref<Lodtalk::Pragma> *)&i);
          pAVar7 = Ref<Lodtalk::AdditionalMethodState>::operator->(&this->additionalMethodState);
          pOVar13 = AdditionalMethodState::getIndexableElements(pAVar7);
          pOVar13[(long)pragma].field_0 = aVar12;
          pPVar11 = Ref<Lodtalk::Pragma>::operator->((Ref<Lodtalk::Pragma> *)&i);
          pvVar14 = Oop::getFirstFieldPointer(&pPVar11->arguments);
          for (paramNode = (value_type)0x0;
              pNVar15 = (value_type)
                        std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::
                        size(this_06), paramNode < pNVar15;
              paramNode = (value_type)((long)&paramNode->_vptr_Node + 1)) {
            ppNVar16 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::
                       operator[](this_06,(size_type)paramNode);
            this_01 = (LiteralNode *)*ppNVar16;
            uVar4 = (*(this_01->super_Node)._vptr_Node[3])();
            if ((uVar4 & 1) == 0) {
              AbstractASTVisitor::error
                        (&this->super_AbstractASTVisitor,(Node *)this_01,
                         "Expected a literal for the pragma parameters.");
            }
            aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)AST::LiteralNode::getValue(this_01);
            *(anon_union_8_4_0eb573b0_for_Oop_0 *)((long)pvVar14 + (long)paramNode * 8) = aVar12;
          }
        }
      }
      Ref<Lodtalk::Pragma>::~Ref((Ref<Lodtalk::Pragma> *)&i);
    }
  }
  this_07 = AST::FunctionalNode::getLocalVariables((FunctionalNode *)temporalCount);
  i_1 = 0;
  localVar = (value_type *)0x0;
  while( true ) {
    pvVar17 = (value_type *)
              std::
              vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
              ::size(this_07);
    iVar5 = (int)i_1;
    if (pvVar17 <= localVar) break;
    p_Var18 = (__shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                 ::operator[](this_07,(size_type)localVar);
    peVar19 = std::
              __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(p_Var18);
    bVar3 = TemporalVariableLookup::isCapturedInClosure(peVar19);
    if (bVar3) {
      peVar19 = std::
                __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var18);
      TemporalVariableLookup::setTemporalVectorIndex(peVar19,this->temporalVectorCount);
      peVar19 = std::
                __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var18);
      i_1 = i_1 + 1;
      TemporalVariableLookup::setTemporalIndex(peVar19,iVar5);
    }
    localVar = (value_type *)
               ((long)&(localVar->
                       super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr + 1);
  }
  if (i_1 != 0) {
    this->temporalVectorCount = this->temporalVectorCount + 1;
    argumentCount = argumentCount + 1;
  }
  this_08 = AST::FunctionalNode::getLocalVariables((FunctionalNode *)temporalCount);
  for (localVar_1 = (value_type *)0x0;
      pvVar17 = (value_type *)
                std::
                vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                ::size(this_08), localVar_1 < pvVar17;
      localVar_1 = (value_type *)
                   ((long)&(localVar_1->
                           super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + 1)) {
    p_Var18 = (__shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                 ::operator[](this_08,(size_type)localVar_1);
    peVar19 = std::
              __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(p_Var18);
    bVar3 = TemporalVariableLookup::isCapturedInClosure(peVar19);
    if (!bVar3) {
      if (localVar_1 < header) {
        peVar19 = std::
                  __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var18);
        TemporalVariableLookup::setTemporalIndex(peVar19,(int)localVar_1);
      }
      else {
        peVar19 = std::
                  __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var18);
        TemporalVariableLookup::setTemporalIndex
                  (peVar19,(int)localVar_1 + this->temporalVectorCount);
        argumentCount = argumentCount + 1;
      }
    }
  }
  if (i_1 != 0) {
    MethodAssembler::Assembler::pushNewArray(&this->gen,iVar5);
    MethodAssembler::Assembler::popStoreTemporal(&this->gen,(int)header);
    for (localVar_2 = (value_type *)0x0; localVar_2 < header;
        localVar_2 = (value_type *)
                     ((long)&(localVar_2->
                             super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + 1)) {
      p_Var18 = (__shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                   ::operator[](this_07,(size_type)localVar_2);
      peVar19 = std::
                __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var18);
      bVar3 = TemporalVariableLookup::isCapturedInClosure(peVar19);
      if (bVar3) {
        MethodAssembler::Assembler::pushTemporal(&this->gen,(int)localVar_2);
        peVar19 = std::
                  __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var18);
        iVar5 = TemporalVariableLookup::getTemporalIndex(peVar19);
        pMVar2 = header;
        peVar19 = std::
                  __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var18);
        iVar6 = TemporalVariableLookup::getTemporalVectorIndex(peVar19);
        MethodAssembler::Assembler::popStoreTemporalInVector(&this->gen,iVar5,(int)pMVar2 + iVar6);
      }
    }
  }
  pSVar20 = AST::MethodAST::getBody((MethodAST *)temporalCount);
  (*(pSVar20->super_Node)._vptr_Node[2])(pSVar20,this);
  bVar3 = MethodAssembler::Assembler::isLastReturn(&this->gen);
  if (!bVar3) {
    MethodAssembler::Assembler::returnReceiver(&this->gen);
  }
  bVar3 = Ref<Lodtalk::AdditionalMethodState>::isNil(&this->additionalMethodState);
  if (bVar3) {
    MethodAssembler::Assembler::addLiteralAlways(&this->gen,&this->selector);
  }
  else {
    newLiteral = Ref<Lodtalk::AdditionalMethodState>::getOop(&this->additionalMethodState);
    MethodAssembler::Assembler::addLiteralAlways(&this->gen,newLiteral);
  }
  MethodAssembler::Assembler::addLiteralAlways(&this->gen,&this->classBinding);
  pointer_00 = MethodAssembler::Assembler::generate
                         (&this->gen,argumentCount,(size_t)header,pragmaCount._7_1_,0);
  this_local = (MethodCompiler *)Oop::fromPointer(pointer_00);
  bVar3 = Ref<Lodtalk::AdditionalMethodState>::isNil(&this->additionalMethodState);
  if (!bVar3) {
    pAVar7 = Ref<Lodtalk::AdditionalMethodState>::operator->(&this->additionalMethodState);
    AdditionalMethodState::setMethod(pAVar7,(Oop *)&this_local);
    pAVar7 = Ref<Lodtalk::AdditionalMethodState>::operator->(&this->additionalMethodState);
    pOVar13 = AdditionalMethodState::getIndexableElements(pAVar7);
    for (pragma_1 = (Pragma *)0x0; pragma_1 < pragmas;
        pragma_1 = (Pragma *)&(pragma_1->super_Object).super_ProtoObject.object_header_.field_0x1) {
      *(MethodCompiler **)(pOVar13[(long)pragma_1].field_0.uintValue + 8) = this_local;
    }
  }
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop MethodCompiler::visitMethodAST(MethodAST *node)
{
    size_t temporalCount = 0;
    size_t argumentCount = 0;

    // Set the local context
    localContext = node;
    temporalVectorCount = 0;

	// Get the method selector.
	auto header = node->getHeader();
	selector = context->makeSelector(header->getSelector());

	// Process the arguments
	auto argumentList = header->getArgumentList();
	if(argumentList)
        argumentCount = argumentList->getArguments().size();

    // Process the pragmas.
    // Vist the pragmas
    auto pragmaList = node->getPragmaList();
    bool hasPrimitive = false;
    size_t pragmaCount = 0;
    if(pragmaList && !pragmaList->getPragmas().empty())
    {
        auto &pragmas = pragmaList->getPragmas();
        pragmaCount = pragmas.size();

        Ref<Pragma> pragmaObject(context);

        additionalMethodState = AdditionalMethodState::basicNew(context, pragmaCount);
        additionalMethodState->setSelector(selector.oop);

        for(size_t i = 0; i < pragmaCount; ++i)
        {
            auto pragma = pragmas[i];
            auto &selector = pragma->getSelectorString();
            auto &params = pragma->getParameters();
            if(selector == "primitive:" || selector == "primitive:error:")
            {
                // Numbered primitive.
                hasPrimitive = true;

                // Ensure the number parameter is a literal
                auto numberParam = params[0];
                if(!numberParam->isLiteral())
                    continue;

                // Read the number parameter.
                auto numberParamLiteral = static_cast<LiteralNode*> (params[0]);
                auto number = numberParamLiteral->getValue();
                if(!number.isSmallInteger())
                    continue;

                // Call the primitive.
                hasPrimitive = true;
                gen.callPrimitive((int)number.decodeSmallInteger());
            }
            else if(selector == "primitive:module:" || selector == "primitive:module:error:")
            {
                // Named primitive.
                hasPrimitive = true;
                gen.callPrimitive(256);
            }

            // Create the pragma.
            pragmaObject = Pragma::create(context);
            pragmaObject->arguments = Oop::fromPointer(Array::basicNativeNew(context, params.size()));
            pragmaObject->keyword = context->makeByteSymbol(pragma->getSelectorString());
            additionalMethodState->getIndexableElements()[i] = pragmaObject.getOop();

            // Set the arguments.
            auto argumentsData = reinterpret_cast<Oop*> (pragmaObject->arguments.getFirstFieldPointer());
            for(size_t j = 0; j < params.size(); ++j)
            {
                auto paramNode = params[j];
                if(!paramNode->isLiteral())
                    error(paramNode, "Expected a literal for the pragma parameters.");

                auto paramLiteralNode = static_cast<LiteralNode*> (paramNode);
                argumentsData[j] = paramLiteralNode->getValue();
            }
        }
    }

    // Count the captured variables.
    auto &blockLocals = node->getLocalVariables();
    size_t capturedCount = 0;
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
        {
            localVar->setTemporalVectorIndex(temporalVectorCount);
            localVar->setTemporalIndex(int(capturedCount++));
        }
    }

    if(capturedCount)
    {
        ++temporalVectorCount;
        ++temporalCount;
    }

    // Compute the local variables indices.
    auto &localVars = node->getLocalVariables();
    for(size_t i = 0; i < localVars.size(); ++i)
    {
        auto &localVar = localVars[i];
        if(!localVar->isCapturedInClosure())
        {
            if(i < argumentCount)
                localVar->setTemporalIndex((int)i);
            else
            {
                localVar->setTemporalIndex(int(i + temporalVectorCount));
                ++temporalCount;
            }
        }
    }

    // Create the temporal vector
    if(capturedCount)
    {
        gen.pushNewArray((int)capturedCount);
        gen.popStoreTemporal((int)argumentCount);

        // Copy the captured arguments into the temp vector
        for(size_t i = 0; i < argumentCount; ++i)
        {
            auto &localVar = blockLocals[i];
            if(localVar->isCapturedInClosure())
            {
                gen.pushTemporal((int)i);
                gen.popStoreTemporalInVector(localVar->getTemporalIndex(), int(argumentCount + localVar->getTemporalVectorIndex()));
            }
        }
    }

	// Visit the method body
	node->getBody()->acceptVisitor(this);

	// Always return
	if(!gen.isLastReturn())
		gen.returnReceiver();

	// Set the method selector/additonal method state.
    if(!additionalMethodState.isNil())
        gen.addLiteralAlways(additionalMethodState.getOop());
    else
        gen.addLiteralAlways(selector);

	// Set the class binding.
	gen.addLiteralAlways(classBinding);
	Oop result = Oop::fromPointer(gen.generate(temporalCount, argumentCount, hasPrimitive));

    // Set some back pointers.
    if(!additionalMethodState.isNil())
    {
        additionalMethodState->setMethod(result);
        auto pragmas = additionalMethodState->getIndexableElements();
        for(size_t i = 0; i < pragmaCount; ++i)
        {
            auto pragma = reinterpret_cast<Pragma*> (pragmas[i].pointer);
            pragma->method = result;
        }
    }

    return result;
}